

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralItem::~IfcStructuralItem(IfcStructuralItem *this)

{
  ~IfcStructuralItem((IfcStructuralItem *)&this[-1].super_IfcProduct.super_IfcObject.field_0x28);
  return;
}

Assistant:

IfcStructuralItem() : Object("IfcStructuralItem") {}